

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void disas_simd_scalar_two_reg_misc(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx;
  bool bVar1;
  _Bool _Var2;
  int val;
  TCGv_i64 tcg_dest;
  TCGv_i64 retval;
  TCGv_i32 arg2;
  uint uVar3;
  uint opcode;
  int unaff_EBP;
  uint rd;
  MemOp memop;
  uint opcode_00;
  uint uVar4;
  uintptr_t o_1;
  uint rn;
  uintptr_t o;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  TCGv_i32 local_50;
  TCGv_i32 local_38;
  
  opcode_00 = insn >> 0xc & 0x1f;
  if (0x1c < opcode_00 - 3) goto switchD_00639ac6_caseD_4;
  tcg_ctx = s->uc->tcg_ctx;
  rd = insn & 0x1f;
  rn = insn >> 5 & 0x1f;
  memop = insn >> 0x16 & MO_64;
  uVar4 = insn & 0x20000000;
  switch(opcode_00) {
  case 3:
    _Var2 = fp_access_check(s);
    if (!_Var2) {
      return;
    }
    handle_2misc_satacc(s,true,uVar4 != 0,false,memop,rn,rd);
    return;
  case 4:
  case 5:
  case 6:
  case 0x10:
  case 0x11:
  case 0x13:
  case 0x15:
  case 0x1e:
    goto switchD_00639ac6_caseD_4;
  case 7:
    goto LAB_00639cc6;
  case 8:
  case 9:
  case 0xb:
    goto switchD_00639ac6_caseD_8;
  case 10:
    break;
  default:
    uVar3 = uVar4 >> 0x17 | insn >> 0x12 & 0x20;
    opcode = uVar3 | opcode_00;
    memop = ((insn >> 0x16 & 1) != 0) + MO_32;
    unaff_EBP = 4;
    switch(uVar3 + opcode_00) {
    case 0x56:
      if ((insn >> 0x16 & 1) == 0) goto switchD_00639ac6_caseD_4;
      _Var2 = fp_access_check(s);
      if (!_Var2) {
        return;
      }
      opcode_00 = 0x56;
      memop = MO_32;
      goto LAB_00639e6d;
    case 0x57:
    case 0x58:
    case 0x59:
      goto switchD_00639ac6_caseD_4;
    case 0x5c:
switchD_00639b97_caseD_5c:
      bVar1 = true;
      opcode_00 = opcode;
      break;
    case 0x5d:
switchD_00639b97_caseD_5d:
      _Var2 = fp_access_check(s);
      if (!_Var2) {
        return;
      }
      handle_simd_intfp_conv(s,rd,rn,1,(uint)(opcode == 0x1d),0,memop);
      return;
    default:
      if (opcode - 0x2c < 3) {
LAB_00639bb5:
        handle_2misc_fcmp_zero(s,opcode,true,true,SUB41(memop,0),rn,rd,in_stack_ffffffffffffff90);
        return;
      }
      if ((1 < opcode - 0x1a) && (1 < opcode - 0x3a)) {
        if (opcode - 0x6c < 2) goto LAB_00639bb5;
        if (1 < opcode - 0x7a) {
          if (opcode != 0x1c) {
            if (opcode == 0x1d) goto switchD_00639b97_caseD_5d;
            if (((opcode == 0x3d) || (opcode == 0x3f)) || (opcode == 0x7d)) {
              _Var2 = fp_access_check(s);
              if (!_Var2) {
                return;
              }
              handle_2misc_reciprocal
                        (s,opcode,true,true,SUB41(memop,0),rn,rd,in_stack_ffffffffffffff90);
              return;
            }
            goto switchD_00639ac6_caseD_4;
          }
          goto switchD_00639b97_caseD_5c;
        }
      }
    case 0x5a:
    case 0x5b:
      bVar1 = true;
      unaff_EBP = (insn >> 0x17 & 1) + (insn >> 0xc & 1) * 2;
      opcode_00 = opcode;
    }
    goto LAB_00639cd1;
  case 0x12:
    if (uVar4 == 0) goto switchD_00639ac6_caseD_4;
  case 0x14:
    if (memop != MO_64) {
      _Var2 = fp_access_check(s);
      if (!_Var2) {
        return;
      }
LAB_00639e6d:
      handle_2misc_narrow(s,true,opcode_00,uVar4 != 0,false,memop,rn,rd);
      return;
    }
    goto switchD_00639ac6_caseD_4;
  }
  if (uVar4 != 0) goto switchD_00639ac6_caseD_4;
switchD_00639ac6_caseD_8:
  if (memop != MO_64) {
switchD_00639ac6_caseD_4:
    unallocated_encoding_aarch64(s);
    return;
  }
  memop = MO_64;
LAB_00639cc6:
  bVar1 = false;
LAB_00639cd1:
  _Var2 = fp_access_check(s);
  if (!_Var2) {
    return;
  }
  if (bVar1) {
    val = arm_rmode_to_sf_aarch64(unaff_EBP);
    local_38 = tcg_const_i32_aarch64(tcg_ctx,val);
    local_50 = (TCGv_i32)get_fpstatus_ptr_aarch64(tcg_ctx,false);
    gen_helper_set_rmode(tcg_ctx,local_38,local_38,(TCGv_ptr)local_50);
  }
  else {
    local_50 = (TCGv_i32)0x0;
    local_38 = (TCGv_i32)0x0;
  }
  if (memop == MO_64) {
    tcg_dest = read_fp_dreg(s,rn);
    retval = tcg_temp_new_i64(tcg_ctx);
    handle_2misc_64(s,opcode_00,uVar4 != 0,retval,tcg_dest,local_50,
                    (TCGv_ptr)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    write_fp_dreg_aarch64(s,rd,retval);
    goto LAB_00639f1e;
  }
  tcg_dest = (TCGv_i64)tcg_temp_new_i32(tcg_ctx);
  retval = (TCGv_i64)tcg_temp_new_i32(tcg_ctx);
  read_vec_element_i32(s,(TCGv_i32)tcg_dest,rn,0,memop);
  if (opcode_00 < 0x3c) {
    if ((0xc0000001c000000U >> ((ulong)opcode_00 & 0x3f) & 1) != 0) {
      arg2 = tcg_const_i32_aarch64(tcg_ctx,0);
      gen_helper_vfp_tosls(tcg_ctx,(TCGv_i32)retval,(TCGv_i32)tcg_dest,arg2,(TCGv_ptr)local_50);
      goto LAB_00639eff;
    }
    if ((ulong)opcode_00 != 7) goto LAB_00639eb2;
    (**(code **)((long)disas_simd_scalar_two_reg_misc::fns[memop] + (ulong)(uVar4 >> 0x1a)))
              (tcg_ctx,retval,tcg_ctx->cpu_env,tcg_dest);
  }
  else {
LAB_00639eb2:
    if ((0x21 < opcode_00 - 0x5a) || ((0x300000007U >> ((ulong)(opcode_00 - 0x5a) & 0x3f) & 1) == 0)
       ) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                 ,0x28a4,(char *)0x0);
    }
    arg2 = tcg_const_i32_aarch64(tcg_ctx,0);
    gen_helper_vfp_touls(tcg_ctx,(TCGv_i32)retval,(TCGv_i32)tcg_dest,arg2,(TCGv_ptr)local_50);
LAB_00639eff:
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(arg2 + (long)tcg_ctx));
  }
  write_fp_sreg(s,rd,(TCGv_i32)retval);
LAB_00639f1e:
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(retval + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_dest + (long)tcg_ctx));
  if (!bVar1) {
    return;
  }
  gen_helper_set_rmode(tcg_ctx,local_38,local_38,(TCGv_ptr)local_50);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(local_38 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(local_50 + (long)tcg_ctx));
  return;
}

Assistant:

static void disas_simd_scalar_two_reg_misc(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int rd = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int opcode = extract32(insn, 12, 5);
    int size = extract32(insn, 22, 2);
    bool u = extract32(insn, 29, 1);
    bool is_fcvt = false;
    int rmode;
    TCGv_i32 tcg_rmode;
    TCGv_ptr tcg_fpstatus;

    switch (opcode) {
    case 0x3: /* USQADD / SUQADD*/
        if (!fp_access_check(s)) {
            return;
        }
        handle_2misc_satacc(s, true, u, false, size, rn, rd);
        return;
    case 0x7: /* SQABS / SQNEG */
        break;
    case 0xa: /* CMLT */
        if (u) {
            unallocated_encoding(s);
            return;
        }
        /* fall through */
    case 0x8: /* CMGT, CMGE */
    case 0x9: /* CMEQ, CMLE */
    case 0xb: /* ABS, NEG */
        if (size != 3) {
            unallocated_encoding(s);
            return;
        }
        break;
    case 0x12: /* SQXTUN */
        if (!u) {
            unallocated_encoding(s);
            return;
        }
        /* fall through */
    case 0x14: /* SQXTN, UQXTN */
        if (size == 3) {
            unallocated_encoding(s);
            return;
        }
        if (!fp_access_check(s)) {
            return;
        }
        handle_2misc_narrow(s, true, opcode, u, false, size, rn, rd);
        return;
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1f:
        /* Floating point: U, size[1] and opcode indicate operation;
         * size[0] indicates single or double precision.
         */
        opcode |= (extract32(size, 1, 1) << 5) | (u << 6);
        size = extract32(size, 0, 1) ? 3 : 2;
        switch (opcode) {
        case 0x2c: /* FCMGT (zero) */
        case 0x2d: /* FCMEQ (zero) */
        case 0x2e: /* FCMLT (zero) */
        case 0x6c: /* FCMGE (zero) */
        case 0x6d: /* FCMLE (zero) */
            handle_2misc_fcmp_zero(s, opcode, true, u, true, size, rn, rd);
            return;
        case 0x1d: /* SCVTF */
        case 0x5d: /* UCVTF */
        {
            bool is_signed = (opcode == 0x1d);
            if (!fp_access_check(s)) {
                return;
            }
            handle_simd_intfp_conv(s, rd, rn, 1, is_signed, 0, size);
            return;
        }
        case 0x3d: /* FRECPE */
        case 0x3f: /* FRECPX */
        case 0x7d: /* FRSQRTE */
            if (!fp_access_check(s)) {
                return;
            }
            handle_2misc_reciprocal(s, opcode, true, u, true, size, rn, rd);
            return;
        case 0x1a: /* FCVTNS */
        case 0x1b: /* FCVTMS */
        case 0x3a: /* FCVTPS */
        case 0x3b: /* FCVTZS */
        case 0x5a: /* FCVTNU */
        case 0x5b: /* FCVTMU */
        case 0x7a: /* FCVTPU */
        case 0x7b: /* FCVTZU */
            is_fcvt = true;
            rmode = extract32(opcode, 5, 1) | (extract32(opcode, 0, 1) << 1);
            break;
        case 0x1c: /* FCVTAS */
        case 0x5c: /* FCVTAU */
            /* TIEAWAY doesn't fit in the usual rounding mode encoding */
            is_fcvt = true;
            rmode = FPROUNDING_TIEAWAY;
            break;
        case 0x56: /* FCVTXN, FCVTXN2 */
            if (size == 2) {
                unallocated_encoding(s);
                return;
            }
            if (!fp_access_check(s)) {
                return;
            }
            handle_2misc_narrow(s, true, opcode, u, false, size - 1, rn, rd);
            return;
        default:
            unallocated_encoding(s);
            return;
        }
        break;
    default:
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    if (is_fcvt) {
        tcg_rmode = tcg_const_i32(tcg_ctx, arm_rmode_to_sf(rmode));
        tcg_fpstatus = get_fpstatus_ptr(tcg_ctx, false);
        gen_helper_set_rmode(tcg_ctx, tcg_rmode, tcg_rmode, tcg_fpstatus);
    } else {
        tcg_rmode = NULL;
        tcg_fpstatus = NULL;
    }

    if (size == 3) {
        TCGv_i64 tcg_rn = read_fp_dreg(s, rn);
        TCGv_i64 tcg_rd = tcg_temp_new_i64(tcg_ctx);

        handle_2misc_64(s, opcode, u, tcg_rd, tcg_rn, tcg_rmode, tcg_fpstatus);
        write_fp_dreg(s, rd, tcg_rd);
        tcg_temp_free_i64(tcg_ctx, tcg_rd);
        tcg_temp_free_i64(tcg_ctx, tcg_rn);
    } else {
        TCGv_i32 tcg_rn = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 tcg_rd = tcg_temp_new_i32(tcg_ctx);

        read_vec_element_i32(s, tcg_rn, rn, 0, size);

        switch (opcode) {
        case 0x7: /* SQABS, SQNEG */
        {
            NeonGenOneOpEnvFn *genfn;
            static NeonGenOneOpEnvFn * const fns[3][2] = {
                { gen_helper_neon_qabs_s8, gen_helper_neon_qneg_s8 },
                { gen_helper_neon_qabs_s16, gen_helper_neon_qneg_s16 },
                { gen_helper_neon_qabs_s32, gen_helper_neon_qneg_s32 },
            };
            genfn = fns[size][u];
            genfn(tcg_ctx, tcg_rd, tcg_ctx->cpu_env, tcg_rn);
            break;
        }
        case 0x1a: /* FCVTNS */
        case 0x1b: /* FCVTMS */
        case 0x1c: /* FCVTAS */
        case 0x3a: /* FCVTPS */
        case 0x3b: /* FCVTZS */
        {
            TCGv_i32 tcg_shift = tcg_const_i32(tcg_ctx, 0);
            gen_helper_vfp_tosls(tcg_ctx, tcg_rd, tcg_rn, tcg_shift, tcg_fpstatus);
            tcg_temp_free_i32(tcg_ctx, tcg_shift);
            break;
        }
        case 0x5a: /* FCVTNU */
        case 0x5b: /* FCVTMU */
        case 0x5c: /* FCVTAU */
        case 0x7a: /* FCVTPU */
        case 0x7b: /* FCVTZU */
        {
            TCGv_i32 tcg_shift = tcg_const_i32(tcg_ctx, 0);
            gen_helper_vfp_touls(tcg_ctx, tcg_rd, tcg_rn, tcg_shift, tcg_fpstatus);
            tcg_temp_free_i32(tcg_ctx, tcg_shift);
            break;
        }
        default:
            g_assert_not_reached();
        }

        write_fp_sreg(s, rd, tcg_rd);
        tcg_temp_free_i32(tcg_ctx, tcg_rd);
        tcg_temp_free_i32(tcg_ctx, tcg_rn);
    }

    if (is_fcvt) {
        gen_helper_set_rmode(tcg_ctx, tcg_rmode, tcg_rmode, tcg_fpstatus);
        tcg_temp_free_i32(tcg_ctx, tcg_rmode);
        tcg_temp_free_ptr(tcg_ctx, tcg_fpstatus);
    }
}